

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall
cmDebugger_impl::PreRunHook
          (cmDebugger_impl *this,cmListFileContext *context,cmListFileFunction *line)

{
  bool bVar1;
  size_t sVar2;
  value_type *pvVar3;
  reference this_00;
  reference ppcVar4;
  cmDebuggerListener **l;
  iterator __end4;
  iterator __begin4;
  set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  *__range4;
  value_type *bp;
  size_t bid;
  lock_guard<std::mutex> lock;
  cmListFileBacktrace local_48;
  size_t local_28;
  size_t currentDepth;
  cmListFileFunction *line_local;
  cmListFileContext *context_local;
  cmDebugger_impl *this_local;
  
  currentDepth = (size_t)line;
  line_local = (cmListFileFunction *)context;
  context_local = (cmListFileContext *)this;
  SetState(this,Running);
  cmListFileContext::operator=(&this->currentLocation,(cmListFileContext *)line_local);
  if (this->breakDepth != -1) {
    (**(this->super_cmDebugger)._vptr_cmDebugger)();
    sVar2 = cmListFileBacktrace::Depth(&local_48);
    cmListFileBacktrace::~cmListFileBacktrace(&local_48);
    local_28 = sVar2;
    if (sVar2 == (long)this->breakDepth) {
      std::atomic<bool>::operator=(&this->breakPending,true);
    }
  }
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&bid,&this->breakpointMutex);
  bp = (value_type *)0x0;
  while( true ) {
    pvVar3 = (value_type *)
             std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::size(&this->breakpoints);
    if (pvVar3 <= bp) goto LAB_0074f24e;
    this_00 = std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::operator[]
                        (&this->breakpoints,(size_type)bp);
    bVar1 = cmBreakpoint::matches(this_00,(cmListFileContext *)line_local);
    if (bVar1) break;
    bp = (value_type *)((long)&bp->Id + 1);
  }
  std::atomic<bool>::operator=(&this->breakPending,true);
  __end4 = std::
           set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
           ::begin(&this->listeners);
  l = (cmDebuggerListener **)
      std::
      set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
      ::end(&this->listeners);
  while (bVar1 = std::operator!=(&__end4,(_Self *)&l), bVar1) {
    ppcVar4 = std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator*(&__end4);
    (*(*ppcVar4)->_vptr_cmDebuggerListener[3])(*ppcVar4,bp);
    std::_Rb_tree_const_iterator<cmDebuggerListener_*>::operator++(&__end4);
  }
LAB_0074f24e:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&bid);
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->breakPending);
  if (bVar1) {
    PauseExecution(this);
  }
  return;
}

Assistant:

void PreRunHook(const cmListFileContext& context,
                  const cmListFileFunction& line) override
  {
    (void)line;

    SetState(State::Running);
    currentLocation = context;

    // Step in / Step out logic. We have a target
    // stack depth, and when we hit it, pause.
    if (breakDepth != -1) {
      auto currentDepth = GetBacktrace().Depth();
      if (currentDepth == (size_t)breakDepth) {
        breakPending = true;
      }
    }

    // Breakpoint detection
    {
      std::lock_guard<std::mutex> lock(breakpointMutex);
      for (size_t bid = 0; bid < breakpoints.size(); bid++) {
        auto& bp = breakpoints[bid];
        if (bp.matches(context)) {
          breakPending = true;
          for (auto& l : listeners) {
            l->OnBreakpoint(bid);
          }
          break;
        }
      }
    }

    // If a break is pending, act on it.
    // Note that we
    if (breakPending) {
      PauseExecution();
    }
  }